

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicstransform.cpp
# Opt level: O0

void __thiscall QGraphicsScale::applyTo(QGraphicsScale *this,QMatrix4x4 *matrix)

{
  long lVar1;
  QGraphicsScalePrivate *pQVar2;
  QVector3D *in_RSI;
  long in_FS_OFFSET;
  QGraphicsScalePrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsScale *)0xa2dd7a);
  QMatrix4x4::translate(in_RSI);
  QMatrix4x4::scale((float)pQVar2->xScale,(float)pQVar2->yScale,(float)pQVar2->zScale);
  ::operator-((QVector3D)*&(pQVar2->origin).v);
  QMatrix4x4::translate(in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScale::applyTo(QMatrix4x4 *matrix) const
{
    Q_D(const QGraphicsScale);
    matrix->translate(d->origin);
    matrix->scale(d->xScale, d->yScale, d->zScale);
    matrix->translate(-d->origin);
}